

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quadtree.c
# Opt level: O1

void AddObject(Level *level,Object *NewObject,int DisplayTree)

{
  int divider;
  Container Cont;
  Container CStack_18;
  
  CStack_18.Type = OBJECT;
  if (DisplayTree == 0) {
    if ((NewObject->Flags >> 8 & 1) == 0) {
      return;
    }
    level = (Level *)&level->CollisionTree;
    divider = 200;
  }
  else {
    if ((NewObject->Flags & 1) == 0) {
      return;
    }
    divider = 0x32;
  }
  CStack_18.Content.O = NewObject;
  AddContent(&level->DisplayTree,&CStack_18,divider);
  return;
}

Assistant:

void AddObject(struct Level *level, struct Object *NewObject, int DisplayTree)
{
   struct Container Cont;

   Cont.Content.O = NewObject;
   Cont.Type = OBJECT;

   if (DisplayTree) {
      if (NewObject->Flags & OBJFLAGS_VISIBLE)
         AddContent(&level->DisplayTree, &Cont, MAX_DISP);
   } else {
      if (NewObject->Flags & FLAGS_COLLIDABLE)
         AddContent(&level->CollisionTree, &Cont, MAX_COLL);
   }
}